

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O3

value object_call(object obj,method m,void **args,size_t argc)

{
  object_impl_interface_method_invoke p_Var1;
  char *pcVar2;
  value pvVar3;
  char *pcVar4;
  
  if (((obj == (object)0x0) || (obj->interface == (object_interface)0x0)) ||
     (p_Var1 = obj->interface->method_invoke, p_Var1 == (object_impl_interface_method_invoke)0x0)) {
    pvVar3 = (value)0x0;
  }
  else {
    pvVar3 = (*p_Var1)(obj,obj->impl,m,args,argc);
    if (pvVar3 == (value)0x0) {
      pcVar2 = obj->name;
      pcVar4 = method_name(m);
      pvVar3 = (value)0x0;
      log_write_impl_va("metacall",0x14f,"object_call",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object %s invoke of method %s",pcVar2,pcVar4);
    }
  }
  return pvVar3;
}

Assistant:

value object_call(object obj, method m, object_args args, size_t argc)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->method_invoke != NULL)
	{
		value v = obj->interface->method_invoke(obj, obj->impl, m, args, argc);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s invoke of method %s", obj->name, method_name(m));
			return NULL;
		}

		return v;
	}

	return NULL;
}